

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O0

void __thiscall
Random_keys::geraPopAleatoriaConfInicial(Random_keys *this,Graph *g,int *idsAbertos,int nAbertos)

{
  int iVar1;
  int iVar2;
  RK_Individual *this_00;
  int local_34;
  RK_Individual *pRStack_30;
  int i;
  RK_Individual *ind;
  int *piStack_20;
  int nAbertos_local;
  int *idsAbertos_local;
  Graph *g_local;
  Random_keys *this_local;
  
  ind._4_4_ = nAbertos;
  piStack_20 = idsAbertos;
  idsAbertos_local = (int *)g;
  g_local = (Graph *)this;
  Graph::markOneDirectionInEdges(g);
  for (local_34 = 0; local_34 < this->tamPop; local_34 = local_34 + 1) {
    this_00 = (RK_Individual *)operator_new(0x28);
    iVar1 = Graph::getEdgesSizes((Graph *)idsAbertos_local);
    iVar2 = Graph::getNumberOfNonModifiable((Graph *)idsAbertos_local);
    RK_Individual::RK_Individual(this_00,iVar1 / 2 - iVar2);
    pRStack_30 = this_00;
    if (local_34 == 0) {
      RK_Individual::geraPesosConfInicial(this_00,piStack_20,ind._4_4_,(Graph *)idsAbertos_local);
    }
    else {
      RK_Individual::generate_random_weights(this_00);
    }
    std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::push_back
              (&this->popAtual,&stack0xffffffffffffffd0);
  }
  std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::operator=
            (&this->popAnterior,&this->popAtual);
  return;
}

Assistant:

void Random_keys::geraPopAleatoriaConfInicial(Graph *g, int *idsAbertos, int nAbertos){

    g->markOneDirectionInEdges();
    RK_Individual *ind;
    for(int i=0; i<this->tamPop; i++){

        ind = new RK_Individual(g->getEdgesSizes() / 2 - g->getNumberOfNonModifiable());
        if(i==0){
            ind->geraPesosConfInicial(idsAbertos, nAbertos, g);
        }
        else{
            ind->generate_random_weights();
        }

        popAtual.push_back(ind);
    }
    popAnterior = popAtual;
}